

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_35d14c::SaveRestoreErrorState::~SaveRestoreErrorState
          (SaveRestoreErrorState *this)

{
  bool bVar1;
  
  if (this->CaptureCMakeErrorValue == false) {
    bVar1 = true;
    if (this->InitialErrorState == false) {
      return;
    }
  }
  else {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (this->InitialErrorState == bVar1) {
      return;
    }
    bVar1 = true;
    if (this->InitialErrorState == false) {
      cmSystemTools::s_FatalErrorOccurred = false;
      bVar1 = false;
    }
  }
  cmSystemTools::s_ErrorOccurred = bVar1;
  return;
}

Assistant:

~SaveRestoreErrorState()
  {
    // if we are not saving the return value then make sure
    // if it was in error it goes back to being in error
    // otherwise leave it be what it is
    if (!this->CaptureCMakeErrorValue) {
      if (this->InitialErrorState) {
        cmSystemTools::SetErrorOccurred();
      }
      return;
    }
    // if we have saved the error in a return variable
    // then put things back exactly like they were
    bool currentState = cmSystemTools::GetErrorOccurredFlag();
    // if the state changed during this command we need
    // to handle it, if not then nothing needs to be done
    if (currentState != this->InitialErrorState) {
      // restore the initial error state
      if (this->InitialErrorState) {
        cmSystemTools::SetErrorOccurred();
      } else {
        cmSystemTools::ResetErrorOccurredFlag();
      }
    }
  }